

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expendable.cpp
# Opt level: O2

bool __thiscall DIS::Expendable::operator==(Expendable *this,Expendable *rhs)

{
  bool bVar1;
  
  bVar1 = EntityType::operator==(&this->_expendable,&rhs->_expendable);
  return ((bVar1 && this->_station == rhs->_station) && this->_quantity == rhs->_quantity) &&
         (this->_padding == rhs->_padding && rhs->_expendableStatus == this->_expendableStatus);
}

Assistant:

bool Expendable::operator ==(const Expendable& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_expendable == rhs._expendable) ) ivarsEqual = false;
     if( ! (_station == rhs._station) ) ivarsEqual = false;
     if( ! (_quantity == rhs._quantity) ) ivarsEqual = false;
     if( ! (_expendableStatus == rhs._expendableStatus) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }